

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O3

uint32_t __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
          (cache<uint256,_SignatureCacheHasher> *this,uint32_t new_size)

{
  _Head_base<0UL,_std::atomic<unsigned_char>_*,_false> _Var1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  float fVar4;
  bit_packed_atomic_flags d;
  _Head_base<0UL,_std::atomic<unsigned_char>_*,_false> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 2;
  if (2 < new_size) {
    uVar2 = new_size;
  }
  this->size = uVar2;
  fVar4 = log2f((float)uVar2);
  this->depth_limit = (uint8_t)(int)fVar4;
  std::vector<uint256,_std::allocator<uint256>_>::resize(&this->table,(ulong)this->size);
  bit_packed_atomic_flags::bit_packed_atomic_flags((bit_packed_atomic_flags *)&local_20,this->size);
  _Var1._M_head_impl =
       (this->collection_flags).mem._M_t.
       super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
       .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl;
  (this->collection_flags).mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = _Var1._M_head_impl;
  if (_Var1._M_head_impl != (atomic<unsigned_char> *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  std::vector<bool,_std::allocator<bool>_>::resize(&this->epoch_flags,(ulong)this->size,false);
  uVar3 = (this->size * 0x2d) / 100;
  uVar2 = 1;
  if (1 < uVar3) {
    uVar2 = uVar3;
  }
  this->epoch_size = uVar2;
  this->epoch_heuristic_counter = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this->size;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t setup(uint32_t new_size)
    {
        // depth_limit must be at least one otherwise errors can occur.
        size = std::max<uint32_t>(2, new_size);
        depth_limit = static_cast<uint8_t>(std::log2(static_cast<float>(size)));
        table.resize(size);
        collection_flags.setup(size);
        epoch_flags.resize(size);
        // Set to 45% as described above
        epoch_size = std::max(uint32_t{1}, (45 * size) / 100);
        // Initially set to wait for a whole epoch
        epoch_heuristic_counter = epoch_size;
        return size;
    }